

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::ResetMarks
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          ResetMarkFlags flags)

{
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
  GetNonEmptyHeapBlockCount
            ((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
              *)this,true);
  if ((flags & ResetMarkFlags_Background) == ResetMarkFlags_HeapEnumeration) {
    GetEmptyHeapBlockCount(this);
  }
  if ((flags & ResetMarkFlags_Background) == ResetMarkFlags_HeapEnumeration) {
    ClearAllocators(this);
  }
  if ((flags & ResetMarkFlags_InThreadImplicitRoots) != ResetMarkFlags_HeapEnumeration) {
    HeapBlockList::
    ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ResetMarks(Memory::ResetMarkFlags)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              (this->fullBlockList,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
               (anon_class_4_1_a7e9dda7)flags);
    HeapBlockList::
    ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ResetMarks(Memory::ResetMarkFlags)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_2_>
              (this->heapBlockList,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
               (anon_class_4_1_a7e9dda7)flags);
  }
  if ((flags & ResetMarkFlags_Background) == ResetMarkFlags_HeapEnumeration) {
    HeapBlockList::
    ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ResetMarks(Memory::ResetMarkFlags)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_3_>
              (this->heapBlockList,this->nextAllocableBlockHead);
    HeapBlockList::
    ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ResetMarks(Memory::ResetMarkFlags)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_4_>
              (this->nextAllocableBlockHead,0);
    return;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::ResetMarks(ResetMarkFlags flags)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount((flags & ResetMarkFlags_Background) != 0));

#if !ENABLE_CONCURRENT_GC
    Assert((flags & ResetMarkFlags_Background) == 0);
#endif

    if ((flags & ResetMarkFlags_Background) == 0)
    {
        // The is equivalent to the ClearAllocators in Rescan
        // But since we are not doing concurrent, we need to do it here.
        ClearAllocators();
    }

    // Note, mark bits are now cleared in HeapBlockMap32::ResetMarks, so we don't need to clear them here.

    if ((flags & ResetMarkFlags_ScanImplicitRoot) != 0)
    {
        HeapBlockList::ForEach(fullBlockList, [flags](TBlockType * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
            Assert(!heapBlock->HasFreeObject());
        });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
        {
            HeapBlockList::ForEach(sweepableHeapBlockList, [flags](TBlockType * heapBlock)
            {
                heapBlock->MarkImplicitRoots();
            });
        }
#endif

        HeapBlockList::ForEach(heapBlockList, [flags](TBlockType * heapBlock)
        {
            heapBlock->MarkImplicitRoots();
        });
    }

#if DBG
    if ((flags & ResetMarkFlags_Background) == 0)
    {
        // When allocations are enabled for buckets during oncurrent sweep we don't keep track of the nextAllocableBlockHead as it directly
        // comes out of the SLIST. As a result, the below validations can't be performed reliably on a heap block.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) || this->IsAnyFinalizableBucket())
#endif
        {
            // Verify that if you are in the heapBlockList, before the nextAllocableBlockHead, we have fully allocated from
            // the block already, except if we have cleared from the allocator, or it is still in the allocator
            HeapBlockList::ForEach(heapBlockList, nextAllocableBlockHead, [](TBlockType * heapBlock)
            {
                // If the heap block is in the allocator, then the heap block may or may not have free object still
                // So we can't assert.  Otherwise, we have free object iff we were cleared from allocator
                Assert(heapBlock->IsInAllocator() || heapBlock->HasFreeObject() == heapBlock->IsClearedFromAllocator());
            });

            // We should still have allocable free object after nextAllocableBlockHead
            HeapBlockList::ForEach(nextAllocableBlockHead, [](TBlockType * heapBlock)
            {
                Assert(heapBlock->HasFreeObject());
            });
        }
    }
#endif
}